

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.hpp
# Opt level: O1

void __thiscall
libtorrent::aux::torrent_hot_members::~torrent_hot_members(torrent_hot_members *this)

{
  pointer pppVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  hash_picker *__ptr;
  
  ::std::unique_ptr<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>::
  ~unique_ptr(&this->m_peer_list);
  pppVar1 = (this->m_connections).
            super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            .
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pppVar1 != (pointer)0x0) {
    operator_delete(pppVar1,(long)(this->m_connections).
                                  super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                  .
                                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pppVar1
                   );
  }
  this_00 = (this->m_torrent_file).
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  __ptr = (this->m_hash_picker)._M_t.
          super___uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
          ._M_t.
          super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
          .super__Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>._M_head_impl;
  if (__ptr != (hash_picker *)0x0) {
    ::std::default_delete<libtorrent::aux::hash_picker>::operator()
              ((default_delete<libtorrent::aux::hash_picker> *)&this->m_hash_picker,__ptr);
  }
  (this->m_hash_picker)._M_t.
  super___uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
  ._M_t.
  super__Tuple_impl<0UL,_libtorrent::aux::hash_picker_*,_std::default_delete<libtorrent::aux::hash_picker>_>
  .super__Head_base<0UL,_libtorrent::aux::hash_picker_*,_false>._M_head_impl = (hash_picker *)0x0;
  ::std::
  unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>::
  ~unique_ptr(&this->m_picker);
  return;
}

Assistant:

struct TORRENT_EXTRA_EXPORT torrent_hot_members
	{
		torrent_hot_members(aux::session_interface& ses
			, add_torrent_params const& p, bool session_paused);

	protected:
		// the piece picker. This is allocated lazily. When we don't
		// have anything in the torrent (for instance, if it hasn't
		// been started yet) or if we have everything, there is no
		// picker. It's allocated on-demand the first time we need
		// it in torrent::need_picker(). In order to tell the
		// difference between having everything and nothing in
		// the case there is no piece picker, see m_have_all.
		std::unique_ptr<piece_picker> m_picker;

		std::unique_ptr<hash_picker> m_hash_picker;

		// TODO: make this a raw pointer. perhaps keep the shared_ptr
		// around further down the object to maintain an owner
		std::shared_ptr<torrent_info> m_torrent_file;

		// This is the sum of all non-pad file sizes. In the next major version
		// this is stored in file_storage and no longer need to be kept here.
		std::int64_t m_size_on_disk = 0;

		// a back reference to the session
		// this torrent belongs to.
		aux::session_interface& m_ses;

		// this vector is sorted at all times, by the pointer value.
		// use sorted_insert() and sorted_find() on it. The GNU STL
		// implementation on Darwin uses significantly less memory to
		// represent a vector than a set, and this set is typically
		// relatively small, and it's cheap to copy pointers.
		aux::vector<peer_connection*> m_connections;

		// the scrape data from the tracker response, this
		// is optional and may be 0xffffff
		std::uint32_t m_complete:24;

		// set to true when this torrent may not download anything
		bool m_upload_mode:1;

		// this is set to false as long as the connections
		// of this torrent haven't been initialized. If we
		// have metadata from the start, connections are
		// initialized immediately, if we didn't have metadata,
		// they are initialized right after files_checked().
		// valid_resume_data() will return false as long as
		// the connections aren't initialized, to avoid
		// them from altering the piece-picker before it
		// has been initialized with files_checked().
		bool m_connections_initialized:1;

		// is set to true when the torrent has
		// been aborted.
		bool m_abort:1;

		// is true if this torrent has allows having peers
		bool m_paused:1;

		// is true if the session is paused, in which case the torrent is
		// effectively paused as well.
		bool m_session_paused:1;

#ifndef TORRENT_DISABLE_SHARE_MODE
		// this is set when the torrent is in share-mode
		bool m_share_mode:1;
#endif

		// this is true if we have all pieces. If it's false,
		// it means we either don't have any pieces, or, if
		// there is a piece_picker object present, it contains
		// the state of how many pieces we have
		bool m_have_all:1;

		// set to true when this torrent has been paused but
		// is waiting to finish all current download requests
		// before actually closing all connections, when in graceful pause mode,
		// m_paused is also true.
		bool m_graceful_pause_mode:1;

		// state subscription. If set, a pointer to this torrent will be added
		// to the session_impl::m_torrent_lists[torrent_state_updates]
		// whenever this torrent's state changes (any state).
		bool m_state_subscription:1;

		// the maximum number of connections for this torrent
		std::uint32_t m_max_connections:24;

		// the state of this torrent (queued, checking, downloading, etc.)
		std::uint32_t m_state:3;

		std::unique_ptr<aux::peer_list> m_peer_list;
	}